

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O3

string * disp::to_string<int>(string *__return_storage_ptr__,int v)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  ostringstream ss;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::operator<<((ostream *)local_190,v);
  std::__cxx11::stringbuf::str();
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,0x132d96);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_1c0 = *plVar3;
    lStack_1b8 = plVar2[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *plVar3;
    local_1d0 = (long *)*plVar2;
  }
  local_1c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0]);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(T v)
	{
		std::ostringstream ss;
		ss<<v;
		return "to_str(" + ss.str() + ")";
	}